

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

bool __thiscall
slang::ast::Expression::requireLValue
          (Expression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  ExpressionKind EVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  bool bVar4;
  bool bVar5;
  Diagnostic *this_00;
  long lVar6;
  
LAB_003ba03a:
  EVar1 = (((RangeSelectExpression *)this)->super_Expression).kind;
  switch(EVar1) {
  case NamedValue:
  case HierarchicalValue:
    goto switchD_003ba04d_caseD_8;
  case UnaryOp:
  case BinaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Replication:
  case Call:
  case DataType:
  case TypeReference:
  case ArbitrarySymbol:
  case LValueReference:
    break;
  case Concatenation:
    bVar4 = Type::isIntegral((((RangeSelectExpression *)this)->super_Expression).type.ptr);
    if (bVar4) {
      pEVar2 = ((RangeSelectExpression *)this)->value_;
      pEVar3 = ((RangeSelectExpression *)this)->left_;
      lVar6 = 0;
      do {
        bVar4 = (long)pEVar3 << 3 == lVar6;
        if (bVar4) {
          return bVar4;
        }
        bVar5 = requireLValue(*(Expression **)((long)&pEVar2->kind + lVar6),context,location,
                              (bitmask<slang::ast::AssignFlags>)(flags.m_bits | 2),(Expression *)0x0
                             );
        lVar6 = lVar6 + 8;
      } while (bVar5);
      return bVar4;
    }
    break;
  case Streaming:
    pEVar2 = ((RangeSelectExpression *)this)->value_;
    pEVar3 = ((RangeSelectExpression *)this)->left_;
    lVar6 = 0;
    do {
      bVar4 = (long)pEVar3 * 0x18 - lVar6 == 0;
      if (bVar4) {
        return bVar4;
      }
      bVar5 = requireLValue(*(Expression **)((long)&pEVar2->kind + lVar6),context,location,
                            (bitmask<slang::ast::AssignFlags>)(flags.m_bits | 2),longestStaticPrefix
                           );
      lVar6 = lVar6 + 0x18;
    } while (bVar5);
    return bVar4;
  case ElementSelect:
    bVar4 = ElementSelectExpression::requireLValueImpl
                      ((ElementSelectExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar4;
  case RangeSelect:
    bVar4 = RangeSelectExpression::requireLValueImpl
                      ((RangeSelectExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar4;
  case MemberAccess:
    bVar4 = MemberAccessExpression::requireLValueImpl
                      ((MemberAccessExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar4;
  case Conversion:
    if (1 < *(int *)&((RangeSelectExpression *)this)->value_) break;
    this = ((RangeSelectExpression *)this)->left_;
    goto LAB_003ba03a;
  case SimpleAssignmentPattern:
    return (bool)*(undefined1 *)&((RangeSelectExpression *)this)->right_;
  default:
    if (EVar1 == Invalid) {
      return false;
    }
  }
  if (((ulong)location & 0xfffffff) == 0) {
    location = (((RangeSelectExpression *)this)->super_Expression).sourceRange.startLoc;
  }
  this_00 = ASTContext::addDiag(context,(DiagCode)0x560007,location);
  Diagnostic::operator<<(this_00,(((RangeSelectExpression *)this)->super_Expression).sourceRange);
  return false;
switchD_003ba04d_caseD_8:
  bVar4 = ValueExpressionBase::requireLValueImpl
                    ((ValueExpressionBase *)this,context,location,flags,longestStaticPrefix);
  return bVar4;
}

Assistant:

bool Expression::requireLValue(const ASTContext& context, SourceLocation location,
                               bitmask<AssignFlags> flags,
                               const Expression* longestStaticPrefix) const {
    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            return ve.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            return access.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (!concat.type->isIntegral())
                break;

            SLANG_ASSERT(!longestStaticPrefix || flags.has(AssignFlags::SlicedPort));
            for (auto op : concat.operands()) {
                if (!op->requireLValue(context, location, flags | AssignFlags::InConcat)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::SimpleAssignmentPattern:
            return as<SimpleAssignmentPatternExpression>().isLValue;
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams()) {
                if (!op.operand->requireLValue(context, location, flags | AssignFlags::InConcat,
                                               longestStaticPrefix)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit()) {
                return conv.operand().requireLValue(context, location, flags, longestStaticPrefix);
            }
            break;
        }
        case ExpressionKind::Invalid:
            return false;
        default:
            break;
    }

    if (!location)
        location = sourceRange.start();

    auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
    diag << sourceRange;
    return false;
}